

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_gc.c
# Opt level: O0

void l2_gc_decrease_ref_count(l2_gc_list *gc_list_p,void *managed_mem_p)

{
  _l2_gc_mem_node *p_Var1;
  l2_gc_mem_node *gc_mem_node_next_p;
  l2_gc_mem_node *gc_mem_node_p;
  l2_gc_mem_node *gc_mem_node_prev_p;
  void *managed_mem_p_local;
  l2_gc_list *gc_list_p_local;
  
  if (gc_list_p->head_p == (_l2_gc_mem_node *)0x0) {
    l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC,managed_mem_p);
  }
  if (gc_list_p->head_p->managed_mem_p == managed_mem_p) {
    gc_list_p->head_p->ref_count = gc_list_p->head_p->ref_count + -1;
    if (gc_list_p->head_p->ref_count < 1) {
      l2_storage_mem_delete(g_parser_p->storage_p,gc_list_p->head_p->managed_mem_p);
      p_Var1 = gc_list_p->head_p->next;
      free(gc_list_p->head_p);
      gc_list_p->head_p = p_Var1;
      gc_list_p->size = gc_list_p->size + -1;
    }
  }
  else {
    gc_mem_node_p = gc_list_p->head_p;
    for (gc_mem_node_next_p = gc_list_p->head_p->next; gc_mem_node_next_p != (l2_gc_mem_node *)0x0;
        gc_mem_node_next_p = gc_mem_node_next_p->next) {
      if (gc_mem_node_next_p->managed_mem_p == managed_mem_p) {
        gc_mem_node_next_p->ref_count = gc_mem_node_next_p->ref_count + -1;
        if (0 < gc_mem_node_next_p->ref_count) {
          return;
        }
        p_Var1 = gc_mem_node_next_p->next;
        l2_storage_mem_delete(g_parser_p->storage_p,gc_mem_node_next_p->managed_mem_p);
        free(gc_mem_node_next_p);
        gc_mem_node_p->next = p_Var1;
        gc_list_p->size = gc_list_p->size + -1;
        return;
      }
      gc_mem_node_p = gc_mem_node_p->next;
    }
  }
  return;
}

Assistant:

void l2_gc_decrease_ref_count(l2_gc_list *gc_list_p, void *managed_mem_p) {
    l2_gc_mem_node *gc_mem_node_prev_p, *gc_mem_node_p, *gc_mem_node_next_p;

    if (gc_list_p->head_p) {
        /* handle the first */
        if (gc_list_p->head_p->managed_mem_p == managed_mem_p) {
            gc_list_p->head_p->ref_count -= 1;
            if (gc_list_p->head_p->ref_count <= 0) {
                l2_storage_mem_delete(g_parser_p->storage_p, gc_list_p->head_p->managed_mem_p);
                gc_mem_node_next_p = gc_list_p->head_p->next;
                free(gc_list_p->head_p);
                gc_list_p->head_p = gc_mem_node_next_p;
                gc_list_p->size -= 1;
            }
            return;
        }

        /* handle the last */
        gc_mem_node_prev_p = gc_list_p->head_p;
        for (gc_mem_node_p = gc_list_p->head_p->next; gc_mem_node_p != L2_NULL_PTR; gc_mem_node_prev_p = gc_mem_node_prev_p->next, gc_mem_node_p = gc_mem_node_p->next) {
            if (gc_mem_node_p->managed_mem_p == managed_mem_p) {
                gc_mem_node_p->ref_count -= 1;
                if (gc_mem_node_p->ref_count <= 0) {
                    gc_mem_node_next_p = gc_mem_node_p->next;
                    l2_storage_mem_delete(g_parser_p->storage_p, gc_mem_node_p->managed_mem_p);
                    free(gc_mem_node_p);
                    gc_mem_node_prev_p->next = gc_mem_node_next_p;
                    gc_list_p->size -= 1;
                }
                return;
            }
        }
    } else {
        l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC, managed_mem_p);
    }
}